

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O2

Float __thiscall
Gecko::FunctionalQuasiconvex::optimum
          (FunctionalQuasiconvex *this,
          vector<Gecko::WeightedValue,_std::allocator<Gecko::WeightedValue>_> *v,Float lmin)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  const_iterator p;
  float *pfVar4;
  float extraout_XMM0_Da;
  float local_4c;
  float local_48;
  float local_40;
  float local_3c;
  undefined8 local_38;
  
  pfVar4 = *(float **)v;
  pfVar1 = *(float **)(v + 8);
  local_4c = *pfVar4;
  lVar2 = (long)pfVar1 - (long)pfVar4 >> 3;
  if (lVar2 != 1) {
    if (lVar2 == 2) {
      if (pfVar4[1] <= pfVar4[3] && pfVar4[3] != pfVar4[1]) {
        local_4c = pfVar4[2];
      }
    }
    else {
      local_48 = 3.4028235e+38;
      for (; pfVar4 != pfVar1; pfVar4 = pfVar4 + 2) {
        local_38 = 0;
        for (pfVar3 = *(float **)v; pfVar3 != pfVar1; pfVar3 = pfVar3 + 2) {
          if (lmin < ABS(*pfVar4 - *pfVar3)) {
            local_3c = pfVar3[1];
            local_40 = ABS(*pfVar4 - *pfVar3);
            (*(this->super_Functional)._vptr_Functional[4])(this,&local_38,&local_40);
            pfVar1 = *(float **)(v + 8);
          }
        }
        (*(this->super_Functional)._vptr_Functional[8])(this,&local_38);
        if (extraout_XMM0_Da < local_48) {
          local_4c = *pfVar4;
          local_48 = extraout_XMM0_Da;
        }
        pfVar1 = *(float **)(v + 8);
      }
    }
  }
  return local_4c;
}

Assistant:

Float optimum(const std::vector<WeightedValue>& v, Float lmin) const
  {
    // Compute the optimum as the node position that minimizes the
    // functional.  Any nodes coincident with each candidate position
    // are excluded from the functional.
    Float x = v[0].value;
    Float min = GECKO_FLOAT_MAX;
    switch (v.size()) {
      case 1:
        // Only one choice.
        break;
      case 2:
        // Functional is the same for both nodes; pick node with
        // larger weight.
        if (v[1].weight > v[0].weight)
          x = v[1].value;
        break;
      default: 
        for (std::vector<WeightedValue>::const_iterator p = v.begin(); p != v.end(); p++) {
          WeightedSum s;
          for (std::vector<WeightedValue>::const_iterator q = v.begin(); q != v.end(); q++) {
            Float l = std::fabs(p->value - q->value);
            if (l > lmin)
              accumulate(s, WeightedValue(l, q->weight));
          }
          Float f = mean(s);
          if (f < min) {
            min = f;
            x = p->value;
          }
        }
        break;
    }
    return x;
  }